

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O3

float Llb_ManComputeCommonAttr(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar2 = p->nRows - p->nFfs;
  if (uVar2 == 0 || p->nRows < p->nFfs) {
    iVar3 = 0;
    iVar4 = 0;
  }
  else {
    uVar5 = 0;
    iVar4 = 0;
    iVar3 = 0;
    do {
      cVar1 = p->pMatrix[iCol2][uVar5];
      if (p->pMatrix[iCol1][uVar5] == '\x01') {
        if (cVar1 == '\x01') {
          iVar3 = iVar3 + 1;
        }
        else {
LAB_0092f2f5:
          iVar4 = iVar4 + 1;
        }
      }
      else if (cVar1 == '\x01') goto LAB_0092f2f5;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  return -(float)iVar4 / (float)(iVar3 + iVar4);
}

Assistant:

float Llb_ManComputeCommonAttr( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int iVar, CountComm = 0, CountDiff = 0;
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    {
        if ( p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 1 )
            CountComm++;
        else if ( p->pMatrix[iCol1][iVar] == 1 || p->pMatrix[iCol2][iVar] == 1 )
            CountDiff++;
    }
/*
    printf( "Attr cost for %4d and %4d:  %4d %4d (%5.2f)\n", 
        iCol1, iCol2, 
        CountDiff, CountComm, 
        -1.0 * CountDiff / ( CountComm + CountDiff ) );
*/
    return -1.0 * CountDiff / ( CountComm + CountDiff );
}